

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseJsonName
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  string_view text;
  string_view text_00;
  LocationRecorder value_location;
  LocationRecorder location;
  
  if ((undefined1  [80])((undefined1  [80])field->field_0 & (undefined1  [80])0x10) !=
      (undefined1  [80])0x0) {
    RecordError(this,(ErrorMaker)ZEXT816(0x105bf8f));
    FieldDescriptorProto::clear_json_name(field);
  }
  LocationRecorder::LocationRecorder(&location,field_location,10);
  LocationRecorder::RecordLegacyLocation(&location,&field->super_Message,OPTION_NAME);
  text._M_str = "json_name";
  text._M_len = 9;
  bVar1 = Consume(this,text);
  if (bVar1) {
    text_00._M_str = "=";
    text_00._M_len = 1;
    bVar1 = Consume(this,text_00);
    if (bVar1) {
      LocationRecorder::LocationRecorder(&value_location,&location);
      LocationRecorder::RecordLegacyLocation(&value_location,&field->super_Message,OPTION_VALUE);
      output = FieldDescriptorProto::_internal_mutable_json_name_abi_cxx11_(field);
      bVar1 = ConsumeString(this,output,(ErrorMaker)ZEXT816(0x105bfaf));
      LocationRecorder::~LocationRecorder(&value_location);
      goto LAB_00be335f;
    }
  }
  bVar1 = false;
LAB_00be335f:
  LocationRecorder::~LocationRecorder(&location);
  return bVar1;
}

Assistant:

bool Parser::ParseJsonName(FieldDescriptorProto* field,
                           const LocationRecorder& field_location,
                           const FileDescriptorProto* containing_file) {
  if (field->has_json_name()) {
    RecordError("Already set option \"json_name\".");
    field->clear_json_name();
  }

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kJsonNameFieldNumber);
  location.RecordLegacyLocation(field,
                                DescriptorPool::ErrorCollector::OPTION_NAME);

  DO(Consume("json_name"));
  DO(Consume("="));

  LocationRecorder value_location(location);
  value_location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::OPTION_VALUE);

  DO(ConsumeString(field->mutable_json_name(),
                   "Expected string for JSON name."));
  return true;
}